

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int create_itermediate_directories(char *path)

{
  int iVar1;
  undefined1 local_2a8 [8];
  cs_stat_t st;
  char buf [500];
  char *s;
  char *path_local;
  
  register0x00000000 = path + 1;
  do {
    if (*stack0xffffffffffffffe0 == '\0') {
      return 1;
    }
    if (*stack0xffffffffffffffe0 == '/') {
      snprintf((char *)(st.__glibc_reserved + 2),500,"%.*s",
               (ulong)(uint)((int)stack0xffffffffffffffe0 - (int)path),path);
      iVar1 = mg_stat((char *)(st.__glibc_reserved + 2),(cs_stat_t *)local_2a8);
      if ((iVar1 != 0) && (iVar1 = mg_mkdir((char *)(st.__glibc_reserved + 2),0x1ed), iVar1 != 0)) {
        return -1;
      }
    }
    register0x00000000 = stack0xffffffffffffffe0 + 1;
  } while( true );
}

Assistant:

static int create_itermediate_directories(const char *path) {
    const char *s;

    /* Create intermediate directories if they do not exist */
    for (s = path + 1; *s != '\0'; s++) {
        if (*s == '/') {
            char buf[MAX_PATH_SIZE];
            cs_stat_t st;
            snprintf(buf, sizeof(buf), "%.*s", (int) (s - path), path);
            buf[sizeof(buf) - 1] = '\0';
            if (mg_stat(buf, &st) != 0 && mg_mkdir(buf, 0755) != 0) {
                return -1;
            }
        }
    }

    return 1;
}